

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O1

void aom_highbd_quantize_b_64x64_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined1 local_60 [16];
  undefined1 auStack_50 [16];
  
  auVar21 = *(undefined1 (*) [16])zbin_ptr;
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar3 = *(undefined1 (*) [16])dequant_ptr;
  auVar4 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar20 = vpsraw_avx(auVar21,0xf);
  auVar5 = vpunpcklwd_avx(auVar21,auVar20);
  auVar21 = vpunpckhwd_avx(auVar21,auVar20);
  auVar14._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar5;
  auVar14._16_16_ = ZEXT116(1) * auVar21;
  auVar21 = vpsraw_avx(auVar1,0xf);
  auVar5 = vpunpcklwd_avx(auVar1,auVar21);
  auVar21 = vpunpckhwd_avx(auVar1,auVar21);
  auVar16._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar5;
  auVar16._16_16_ = ZEXT116(1) * auVar21;
  auVar21 = vpsraw_avx(auVar2,0xf);
  local_a0 = vpunpcklwd_avx(auVar2,auVar21);
  auStack_90 = vpunpckhwd_avx(auVar2,auVar21);
  auVar21 = vpsraw_avx(auVar3,0xf);
  local_80 = vpunpcklwd_avx(auVar3,auVar21);
  auStack_70 = vpunpckhwd_avx(auVar3,auVar21);
  auVar21 = vpsraw_avx(auVar4,0xf);
  local_60 = vpunpcklwd_avx(auVar4,auVar21);
  auStack_50 = vpunpckhwd_avx(auVar4,auVar21);
  auVar19._8_4_ = 2;
  auVar19._0_8_ = 0x200000002;
  auVar19._12_4_ = 2;
  auVar19._16_4_ = 2;
  auVar19._20_4_ = 2;
  auVar19._24_4_ = 2;
  auVar19._28_4_ = 2;
  auVar14 = vpaddd_avx2(auVar14,auVar19);
  auVar18 = vpsrad_avx2(auVar14,2);
  auVar14 = vpaddd_avx2(auVar16,auVar19);
  local_c0 = vpsrad_avx2(auVar14,2);
  auVar16 = vpcmpeqd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar4));
  local_e0 = vpaddd_avx2(auVar18,auVar16);
  auVar14 = *(undefined1 (*) [32])coeff_ptr;
  auVar19 = vpabsd_avx2(auVar14);
  auVar18 = vpcmpgtd_avx2(auVar18,auVar19);
  auVar16 = auVar16 & ~auVar18;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar16 >> 0x7f,0) == '\0') &&
        (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar16 >> 0xbf,0) == '\0') &&
      (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar16[0x1f]) {
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar15._0_32_;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar15._0_32_;
  }
  else {
    auVar16 = vpaddd_avx2(auVar19,local_c0);
    auVar16 = vpandn_avx2(auVar18,auVar16);
    auVar18._16_16_ = auStack_90;
    auVar18._0_16_ = local_a0;
    auVar24._16_16_ = auStack_50;
    auVar24._0_16_ = local_60;
    auVar19 = vpmuldq_avx2(auVar16,auVar18);
    auVar22 = vpsrlq_avx2(auVar16,0x20);
    auVar18 = vpsrlq_avx2(auVar18,0x20);
    auVar18 = vpmuldq_avx2(auVar22,auVar18);
    auVar22 = vpsrlq_avx2(auVar19,0x10);
    auVar19 = vpsllq_avx2(auVar18,0x10);
    auVar19 = vpblendd_avx2(auVar22,auVar19,0xaa);
    auVar16 = vpaddd_avx2(auVar16,auVar19);
    auVar19 = vpmuldq_avx2(auVar16,auVar24);
    auVar16 = vpsrlq_avx2(auVar16,0x20);
    auVar18 = vpsrlq_avx2(auVar24,0x20);
    auVar16 = vpmuldq_avx2(auVar16,auVar18);
    auVar19 = vpsrlq_avx2(auVar19,0xe);
    auVar16 = vpsllq_avx2(auVar16,0x12);
    auVar19 = vpblendd_avx2(auVar19,auVar16,0xaa);
    auVar22._16_16_ = auStack_70;
    auVar22._0_16_ = local_80;
    auVar16 = vpmulld_avx2(auVar19,auVar22);
    auVar18 = vpsrld_avx2(auVar16,2);
    auVar16 = vpcmpgtd_avx2(auVar19,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar19 = vpsignd_avx2(auVar19,auVar14);
    auVar14 = vpsignd_avx2(auVar18,auVar14);
    *(undefined1 (*) [32])qcoeff_ptr = auVar19;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar14;
    auVar14 = vpackssdw_avx2(auVar16,auVar16);
    auVar17._0_16_ = ZEXT116(1) * *(undefined1 (*) [16])iscan + ZEXT116(0) * auVar14._0_16_;
    auVar17._16_16_ = ZEXT116(1) * auVar14._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])iscan;
    auVar16 = vpermq_avx2(auVar14,0xd8);
    auVar14 = vpsubw_avx2(auVar17,auVar16);
    auVar14 = vpand_avx2(auVar14,auVar16);
    auVar14 = vpmaxsw_avx2(auVar14,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar15 = ZEXT3264(auVar14);
  }
  auVar21 = auVar15._0_16_;
  lVar12 = 0;
  do {
    uVar7 = *(undefined8 *)(local_c0 + lVar12);
    uVar8 = *(undefined8 *)(local_c0 + lVar12 + 8);
    *(undefined8 *)(local_e0 + lVar12) = uVar7;
    *(undefined8 *)(local_e0 + lVar12 + 8) = uVar8;
    *(undefined8 *)(local_e0 + lVar12 + 0x10) = uVar7;
    *(undefined8 *)(local_e0 + lVar12 + 0x18) = uVar8;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0xa0);
  if (8 < n_coeffs) {
    auVar9._16_16_ = auStack_90;
    auVar9._0_16_ = local_a0;
    auVar10._16_16_ = auStack_70;
    auVar10._0_16_ = local_80;
    auVar16 = vpsrad_avx2(auVar9,0x1f);
    auVar14 = vpshufd_avx2(auVar9,0xf5);
    auVar16 = vpblendd_avx2(auVar14,auVar16,0xaa);
    auVar11._16_16_ = auStack_50;
    auVar11._0_16_ = local_60;
    auVar19 = vpsrad_avx2(auVar11,0x1f);
    auVar14 = vpshufd_avx2(auVar11,0xf5);
    auVar14 = vpblendd_avx2(auVar14,auVar19,0xaa);
    lVar13 = n_coeffs + 8;
    lVar12 = 0x10;
    auVar19 = vpsrlq_avx2(auVar16,0x20);
    do {
      auVar18 = *(undefined1 (*) [32])((long)coeff_ptr + lVar12 * 2);
      auVar22 = vpabsd_avx2(auVar18);
      auVar24 = vpcmpgtd_avx2(auVar22,local_e0);
      auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0x7f,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0xbf,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f])
      {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar12 * 2) = auVar17;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar12 * 2) = auVar17;
      }
      else {
        auVar22 = vpaddd_avx2(auVar22,local_c0);
        auVar24 = vpand_avx2(auVar24,auVar22);
        auVar23 = vpmuldq_avx2(auVar24,auVar9);
        auVar25 = vpsrad_avx2(auVar24,0x1f);
        auVar6 = vpshufd_avx2(auVar24,0xf5);
        auVar22 = vpmuludq_avx2(auVar6,auVar19);
        auVar25 = vpsrlq_avx2(auVar25,0x20);
        auVar25 = vpmuludq_avx2(auVar25,auVar16);
        auVar22 = vpaddq_avx2(auVar22,auVar25);
        auVar25 = vpsllq_avx2(auVar22,0x20);
        auVar22 = vpmuludq_avx2(auVar6,auVar16);
        auVar22 = vpaddq_avx2(auVar22,auVar25);
        auVar23 = vpsrlq_avx2(auVar23,0x10);
        auVar22 = vpsllq_avx2(auVar22,0x10);
        auVar22 = vpblendd_avx2(auVar23,auVar22,0xaa);
        auVar22 = vpaddd_avx2(auVar24,auVar22);
        auVar24 = vpmuldq_avx2(auVar22,auVar11);
        auVar23 = vpsrad_avx2(auVar22,0x1f);
        auVar25 = vpshufd_avx2(auVar22,0xf5);
        auVar22 = vpsrlq_avx2(auVar14,0x20);
        auVar22 = vpmuludq_avx2(auVar25,auVar22);
        auVar23 = vpsrlq_avx2(auVar23,0x20);
        auVar23 = vpmuludq_avx2(auVar23,auVar14);
        auVar22 = vpaddq_avx2(auVar22,auVar23);
        auVar23 = vpsllq_avx2(auVar22,0x20);
        auVar22 = vpmuludq_avx2(auVar25,auVar14);
        auVar22 = vpaddq_avx2(auVar22,auVar23);
        auVar24 = vpsrlq_avx2(auVar24,0xe);
        auVar22 = vpsllq_avx2(auVar22,0x12);
        auVar24 = vpblendd_avx2(auVar24,auVar22,0xaa);
        auVar22 = vpmulld_avx2(auVar10,auVar24);
        auVar23 = vpsrld_avx2(auVar22,2);
        auVar22 = vpcmpgtd_avx2(auVar24,auVar17);
        auVar24 = vpsignd_avx2(auVar24,auVar18);
        auVar18 = vpsignd_avx2(auVar23,auVar18);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar12 * 2) = auVar24;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar12 * 2) = auVar18;
        auVar18 = vpackssdw_avx2(auVar22,auVar22);
        auVar23._0_16_ =
             ZEXT116(0) * auVar15._0_16_ + ZEXT116(1) * *(undefined1 (*) [16])((long)iscan + lVar12)
        ;
        auVar23._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15._0_16_;
        auVar22 = vpermq_avx2(auVar18,0xd8);
        auVar18 = vpsubw_avx2(auVar23,auVar22);
        auVar18 = vpand_avx2(auVar18,auVar22);
        auVar18 = vpmaxsw_avx2(auVar18,auVar15._0_32_);
        auVar15 = ZEXT3264(auVar18);
      }
      auVar21 = auVar15._0_16_;
      lVar12 = lVar12 + 0x10;
      lVar13 = lVar13 + -8;
    } while (0x10 < lVar13);
  }
  auVar1 = vpshufd_avx(auVar21,0xe);
  auVar21 = vpmaxsw_avx(auVar21,auVar1);
  auVar1 = vpshuflw_avx(auVar21,0xe);
  auVar21 = vpmaxsw_avx(auVar21,auVar1);
  auVar1 = vpshuflw_avx(auVar21,1);
  auVar21 = vpmaxsw_avx(auVar21,auVar1);
  vpextrw_avx(auVar21,0);
  return;
}

Assistant:

void aom_highbd_quantize_b_64x64_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];
  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 2);

  quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 2);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 2);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}